

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O3

Config * flatbuffers::anon_unknown_26::RustDefaultConfig(void)

{
  Config *extraout_RAX;
  undefined4 *in_RDI;
  char *__end;
  
  *in_RDI = 8;
  in_RDI[1] = 4;
  in_RDI[2] = 3;
  in_RDI[3] = 3;
  *(undefined8 *)(in_RDI + 4) = 8;
  in_RDI[6] = 8;
  *(undefined4 **)(in_RDI + 8) = in_RDI + 0xc;
  std::__cxx11::string::_M_construct<char_const*>((string *)(in_RDI + 8),"::","");
  *(undefined8 *)(in_RDI + 0x10) = 0x300000000;
  *(undefined4 **)(in_RDI + 0x12) = in_RDI + 0x16;
  std::__cxx11::string::_M_construct<char_const*>((string *)(in_RDI + 0x12),"::","");
  *(undefined4 **)(in_RDI + 0x1a) = in_RDI + 0x1e;
  std::__cxx11::string::_M_construct<char_const*>((string *)(in_RDI + 0x1a),"");
  *(undefined4 **)(in_RDI + 0x22) = in_RDI + 0x26;
  std::__cxx11::string::_M_construct<char_const*>((string *)(in_RDI + 0x22),"T","");
  *(undefined4 **)(in_RDI + 0x2a) = in_RDI + 0x2e;
  std::__cxx11::string::_M_construct<char_const*>((string *)(in_RDI + 0x2a),"");
  *(undefined4 **)(in_RDI + 0x32) = in_RDI + 0x36;
  std::__cxx11::string::_M_construct<char_const*>((string *)(in_RDI + 0x32),"_","");
  *(undefined8 *)(in_RDI + 0x3a) = 0x300000003;
  *(undefined4 **)(in_RDI + 0x3c) = in_RDI + 0x40;
  std::__cxx11::string::_M_construct<char_const*>((string *)(in_RDI + 0x3c),"");
  *(undefined4 **)(in_RDI + 0x44) = in_RDI + 0x48;
  std::__cxx11::string::_M_construct<char_const*>((string *)(in_RDI + 0x44),"_generated","");
  *(undefined4 **)(in_RDI + 0x4c) = in_RDI + 0x50;
  std::__cxx11::string::_M_construct<char_const*>((string *)(in_RDI + 0x4c),".rs","");
  return extraout_RAX;
}

Assistant:

static Namer::Config RustDefaultConfig() {
  // Historical note: We've been using "keep" casing since the original
  // implementation, presumably because Flatbuffers schema style and Rust style
  // roughly align. We are not going to enforce proper casing since its an
  // unnecessary breaking change.
  return { /*types=*/Case::kKeep,
           /*constants=*/Case::kScreamingSnake,
           /*methods=*/Case::kSnake,
           /*functions=*/Case::kSnake,
           /*fields=*/Case::kKeep,
           /*variables=*/Case::kUnknown,  // Unused.
           /*variants=*/Case::kKeep,
           /*enum_variant_seperator=*/"::",
           /*escape_keywords=*/Namer::Config::Escape::BeforeConvertingCase,
           /*namespaces=*/Case::kSnake,
           /*namespace_seperator=*/"::",
           /*object_prefix=*/"",
           /*object_suffix=*/"T",
           /*keyword_prefix=*/"",
           /*keyword_suffix=*/"_",
           /*filenames=*/Case::kSnake,
           /*directories=*/Case::kSnake,
           /*output_path=*/"",
           /*filename_suffix=*/"_generated",
           /*filename_extension=*/".rs" };
}